

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void allocate_imp_map<ImputedData<long,long_double>,InputData<float,long>>
               (robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *impute_map,InputData<float,_long> *input_data)

{
  reference pvVar1;
  long in_RSI;
  size_t row;
  ImputedData<long,_long_double> *in_stack_fffffffffffffed8;
  ImputedData<long,_long_double> *in_stack_fffffffffffffee0;
  size_t in_stack_ffffffffffffff30;
  InputData<float,_long> *in_stack_ffffffffffffff38;
  ImputedData<long,_long_double> *in_stack_ffffffffffffff40;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 < *(ulong *)(in_RSI + 0x30); local_18 = local_18 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x98),local_18);
    if (*pvVar1 != '\0') {
      ImputedData<long,long_double>::ImputedData<InputData<float,long>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      in_stack_fffffffffffffee0 =
           tsl::
           robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           ::operator[]((robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                         *)in_stack_fffffffffffffee0,(unsigned_long *)in_stack_fffffffffffffed8);
      ImputedData<long,_long_double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8)
      ;
      ImputedData<long,_long_double>::~ImputedData(in_stack_fffffffffffffee0);
    }
  }
  return;
}

Assistant:

void allocate_imp_map(hashed_map<size_t, ImputedData> &impute_map, InputData &input_data)
{
    for (size_t row = 0; row < input_data.nrows; row++)
        if (input_data.has_missing[row])
            impute_map[row] = ImputedData(input_data, row);
}